

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

int SSE4x4_C(uint8_t *a,uint8_t *b)

{
  int iVar1;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  
  iVar1 = GetSSE(in_RDI,in_RSI,4,4);
  return iVar1;
}

Assistant:

static int SSE4x4_C(const uint8_t* a, const uint8_t* b) {
  return GetSSE(a, b, 4, 4);
}